

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_buffer_block(CompilerHLSL *this,SPIRVariable *var)

{
  ID *__k;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar1;
  bool bVar2;
  SPIRType *type;
  size_type sVar3;
  SPIRType *pSVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  string *psVar9;
  CompilerError *pCVar10;
  char *pcVar11;
  string *ts_2;
  TypedID<(spirv_cross::Types)0> *in_R9;
  uint32_t index;
  ulong uVar12;
  long lVar13;
  char (*in_stack_fffffffffffffee8) [54];
  ID *pIVar14;
  string backup_name;
  uint32_t failed_index_1;
  uint uStack_dc;
  string member_name;
  Bitset flags;
  string local_78;
  TypedID<(spirv_cross::Types)1> *local_58;
  uint32_t failed_index;
  uint uStack_4c;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  if ((var->storage == StorageClassStorageBuffer) ||
     (bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock),
     bVar2)) {
    ParsedIR::get_buffer_block_flags(&flags,&(this->super_CompilerGLSL).super_Compiler.ir,var);
    if (((uint32_t)flags.lower >> 0x18 & 1) == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
      bVar2 = !bVar2;
    }
    backup_name._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
    sVar3 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                    (key_type *)&backup_name);
    pcVar11 = "RasterizerOrderedByteAddressBuffer ";
    if (sVar3 == 0) {
      pcVar11 = "RWByteAddressBuffer ";
    }
    _failed_index = "ByteAddressBuffer ";
    if (!bVar2) {
      _failed_index = pcVar11;
    }
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
    _failed_index_1 = "globallycoherent ";
    if (bVar2 || ((uint32_t)flags.lower >> 0x17 & 1) == 0) {
      _failed_index_1 = "";
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&backup_name,this,(ulong)(var->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&member_name,this,type);
    to_resource_binding_abi_cxx11_(&local_78,this,var);
    CompilerGLSL::
    statement<char_const*,char_const*&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char **)&failed_index_1,(char **)&failed_index,
               &backup_name,&member_name,&local_78,(char (*) [2])0x304bae);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&member_name);
    ::std::__cxx11::string::~string((string *)&backup_name);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&flags.higher._M_h);
    return;
  }
  __k = &(type->super_IVariant).self;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    flags.lower._0_4_ = (var->super_IVariant).self.id;
    pmVar5 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).flattened_structs,(key_type *)&flags);
    *pmVar5 = false;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&flags,this,(ulong)__k->id,0);
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
    pIVar14 = &(var->super_IVariant).self;
    if ((((pmVar6->decoration).alias._M_string_length == 0) ||
        (iVar7 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(this->super_CompilerGLSL).resource_names._M_h,(key_type *)&flags),
        iVar7.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0)) ||
       (iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->super_CompilerGLSL).block_names._M_h,(key_type *)&flags),
       iVar7.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[4])
                (&backup_name,this,(ulong)pIVar14->id);
      ::std::__cxx11::string::_M_assign((string *)&flags);
      ::std::__cxx11::string::~string((string *)&backup_name);
    }
    this_00 = &(this->super_CompilerGLSL).block_names;
    CompilerGLSL::add_variable
              (&this->super_CompilerGLSL,this_00,&(this->super_CompilerGLSL).resource_names,
               (string *)&flags);
    if (flags.higher._M_h._M_buckets == (__buckets_ptr)0x0) {
      pSVar4 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                (&backup_name,(spirv_cross *)0x30ed65,(char (*) [2])&(pSVar4->super_IVariant).self,
                 (TypedID<(spirv_cross::Types)0> *)0x30ed65,(char (*) [2])pIVar14,in_R9);
      ::std::__cxx11::string::operator=((string *)&flags,(string *)&backup_name);
      ::std::__cxx11::string::~string((string *)&backup_name);
    }
    _failed_index_1 = (char *)((ulong)uStack_dc << 0x20);
    ts_2 = (string *)0x0;
    bVar2 = CompilerGLSL::buffer_is_packing_standard
                      (&this->super_CompilerGLSL,type,BufferPackingHLSLCbufferPackOffset,
                       &failed_index_1,0,0xffffffff);
    if (!bVar2) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerGLSL::to_member_name_abi_cxx11_
                (&member_name,&this->super_CompilerGLSL,type,failed_index_1);
      join<char_const(&)[12],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                (&backup_name,(spirv_cross *)0x30e7c5,(char (*) [12])pIVar14,
                 (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&flags,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "), member index ",(char (*) [17])&failed_index_1,(uint *)" (name: ",
                 (char (*) [9])&member_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ") cannot be expressed with either HLSL packing layout or packoffset.",
                 (char (*) [69])pIVar14);
      CompilerError::CompilerError(pCVar10,&backup_name);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    Compiler::set_extended_decoration((Compiler *)this,__k->id,SPIRVCrossDecorationExplicitOffset,0)
    ;
    ::std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)this_00,(value_type *)&flags);
    backup_name._M_dataplus._M_p._0_4_ = pIVar14->id;
    pmVar8 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.declared_block_names,
                          (key_type *)&backup_name);
    ::std::__cxx11::string::_M_assign((string *)pmVar8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(type->member_name_cache)._M_h);
    CompilerGLSL::preserve_alias_on_reset(&this->super_CompilerGLSL,pIVar14->id);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,pIVar14->id);
    to_resource_binding_abi_cxx11_(&backup_name,this,var);
    CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              (&this->super_CompilerGLSL,(char (*) [9])"cbuffer ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
               &backup_name);
    ::std::__cxx11::string::~string((string *)&backup_name);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    local_58 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               ptr;
    uVar12 = 0;
    for (lVar13 = (type->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size << 2;
        lVar13 != 0; lVar13 = lVar13 + -4) {
      index = (uint32_t)uVar12;
      CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type,index);
      psVar9 = Compiler::get_member_name_abi_cxx11_((Compiler *)this,(TypeID)__k->id,index);
      ::std::__cxx11::string::string((string *)&backup_name,(string *)psVar9);
      CompilerGLSL::to_member_name_abi_cxx11_(&member_name,&this->super_CompilerGLSL,type,index);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                ((string *)&failed_index,this,(ulong)pIVar14->id,1);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                (&local_78,(spirv_cross *)&failed_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ed65,
                 (char (*) [2])&member_name,ts_2);
      ::std::__cxx11::string::operator=((string *)&member_name,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&failed_index);
      ParsedIR::sanitize_underscores(&member_name);
      Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,index,&member_name);
      uVar1 = local_58[uVar12].id;
      ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)&failed_index);
      ts_2 = &local_78;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                (this,type,(ulong)uVar1,uVar12 & 0xffffffff,&local_78,0);
      ::std::__cxx11::string::~string((string *)&local_78);
      Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,index,&backup_name);
      ::std::__cxx11::string::~string((string *)&member_name);
      ::std::__cxx11::string::~string((string *)&backup_name);
      uVar12 = uVar12 + 1;
    }
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  }
  else {
    if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x33) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&flags,
                 "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1."
                 ,(allocator *)&backup_name);
      CompilerError::CompilerError(pCVar10,(string *)&flags);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(type->super_IVariant).self.id);
    pIVar14 = &(var->super_IVariant).self;
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
    _failed_index = (char *)((ulong)uStack_4c << 0x20);
    bVar2 = CompilerGLSL::buffer_is_packing_standard
                      (&this->super_CompilerGLSL,type,BufferPackingHLSLCbuffer,&failed_index,0,
                       0xffffffff);
    if (!bVar2) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&backup_name,this,(ulong)__k->id,1);
      CompilerGLSL::to_member_name_abi_cxx11_
                (&member_name,&this->super_CompilerGLSL,type,failed_index);
      join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
                ((string *)&flags,(spirv_cross *)"HLSL ConstantBuffer<T> ID ",(char (*) [27])pIVar14
                 ,(TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&backup_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "), member index ",(char (*) [17])&failed_index,(uint *)" (name: ",
                 (char (*) [9])&member_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ") cannot be expressed with normal HLSL packing rules.",in_stack_fffffffffffffee8);
      CompilerError::CompilerError(pCVar10,(string *)&flags);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,__k->id);
    CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar4);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&flags,this,(ulong)__k->id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&backup_name,this,(ulong)pIVar14->id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&member_name,this,type);
    to_resource_binding_abi_cxx11_(&local_78,this,var);
    CompilerGLSL::
    statement<char_const(&)[16],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [16])"ConstantBuffer<",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
               (char (*) [3])0x30a5b8,&backup_name,&member_name,&local_78,(char (*) [2])0x304bae);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&member_name);
    ::std::__cxx11::string::~string((string *)&backup_name);
  }
  ::std::__cxx11::string::~string((string *)&flags);
  return;
}

Assistant:

void CompilerHLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	bool is_uav = var.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock);

	if (is_uav)
	{
		Bitset flags = ir.get_buffer_block_flags(var);
		bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
		bool is_coherent = flags.get(DecorationCoherent) && !is_readonly;
		bool is_interlocked = interlocked_resources.count(var.self) > 0;
		const char *type_name = "ByteAddressBuffer ";
		if (!is_readonly)
			type_name = is_interlocked ? "RasterizerOrderedByteAddressBuffer " : "RWByteAddressBuffer ";
		add_resource_name(var.self);
		statement(is_coherent ? "globallycoherent " : "", type_name, to_name(var.self), type_to_array_glsl(type),
		          to_resource_binding(var), ";");
	}
	else
	{
		if (type.array.empty())
		{
			// Flatten the top-level struct so we can use packoffset,
			// this restriction is similar to GLSL where layout(offset) is not possible on sub-structs.
			flattened_structs[var.self] = false;

			// Prefer the block name if possible.
			auto buffer_name = to_name(type.self, false);
			if (ir.meta[type.self].decoration.alias.empty() ||
			    resource_names.find(buffer_name) != end(resource_names) ||
			    block_names.find(buffer_name) != end(block_names))
			{
				buffer_name = get_block_fallback_name(var.self);
			}

			add_variable(block_names, resource_names, buffer_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (buffer_name.empty())
				buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("cbuffer ID ", var.self, " (name: ", buffer_name, "), member index ",
				                       failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			block_names.insert(buffer_name);

			// Save for post-reflection later.
			declared_block_names[var.self] = buffer_name;

			type.member_name_cache.clear();
			// var.self can be used as a backup name for the block name,
			// so we need to make sure we don't disturb the name here on a recompile.
			// It will need to be reset if we have to recompile.
			preserve_alias_on_reset(var.self);
			add_resource_name(var.self);
			statement("cbuffer ", buffer_name, to_resource_binding(var));
			begin_scope();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				auto backup_name = get_member_name(type.self, i);
				auto member_name = to_member_name(type, i);
				member_name = join(to_name(var.self), "_", member_name);
				ParsedIR::sanitize_underscores(member_name);
				set_member_name(type.self, i, member_name);
				emit_struct_member(type, member, i, "");
				set_member_name(type.self, i, backup_name);
				i++;
			}

			end_scope_decl();
			statement("");
		}
		else
		{
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1.");

			add_resource_name(type.self);
			add_resource_name(var.self);

			// ConstantBuffer<T> does not support packoffset, so it is unuseable unless everything aligns as we expect.
			uint32_t failed_index = 0;
			if (!buffer_is_packing_standard(type, BufferPackingHLSLCbuffer, &failed_index))
			{
				SPIRV_CROSS_THROW(join("HLSL ConstantBuffer<T> ID ", var.self, " (name: ", to_name(type.self),
				                       "), member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with normal HLSL packing rules."));
			}

			emit_struct(get<SPIRType>(type.self));
			statement("ConstantBuffer<", to_name(type.self), "> ", to_name(var.self), type_to_array_glsl(type),
			          to_resource_binding(var), ";");
		}
	}
}